

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O2

void __thiscall MDIOAnalyzer::ProcessRegAddrDevTypeFrame(MDIOAnalyzer *this)

{
  MDIOFrameType MVar1;
  long lVar2;
  int iVar3;
  MDIOAnalyzer *this_00;
  bool bVar4;
  DataBuilder opcode;
  U64 value;
  BitState bit;
  undefined8 local_50;
  auto_ptr<MDIOAnalyzerSettings> local_48;
  undefined1 local_38;
  undefined1 local_37;
  
  lVar2 = AnalyzerChannelData::GetSampleNumber();
  DataBuilder::DataBuilder(&opcode);
  iVar3 = 5;
  DataBuilder::Reset((ulonglong *)&opcode,(ShiftOrder)&value,0);
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    GetBit(this,&bit,&this->mMdcPosedgeArrows);
    DataBuilder::AddBit((BitState)&opcode);
  }
  this_00 = (MDIOAnalyzer *)&bit;
  Frame::Frame((Frame *)this_00);
  if ((this->mCurrentPacket).clause == MDIO_C22_PACKET) {
    local_38 = 7;
  }
  else {
    MVar1 = GetDevType(this_00,&value);
    local_38 = (undefined1)MVar1;
  }
  local_48._M_ptr = (MDIOAnalyzerSettings *)value;
  local_37 = 0;
  _bit = lVar2 + 1;
  local_50 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  Analyzer::ReportProgress((ulonglong)this);
  Frame::~Frame((Frame *)&bit);
  DataBuilder::~DataBuilder(&opcode);
  return;
}

Assistant:

void MDIOAnalyzer::ProcessRegAddrDevTypeFrame()
{
    // starting sample of the start frame
    U64 starting_sample = mMdio->GetSampleNumber() + 1;

    // get the value of the 5 bits of register address or devtype frame
    DataBuilder opcode;
    U64 value;
    opcode.Reset( &value, AnalyzerEnums::MsbFirst, 5 );
    for( U32 i = 0; i < 5; ++i )
    {
        BitState bit;
        GetBit( bit, mMdcPosedgeArrows );
        opcode.AddBit( bit );
    }

    // create and set the phyaddr frame
    Frame frame;
    if( mCurrentPacket.clause == MDIO_C22_PACKET )
    {
        frame.mType = MDIO_C22_REGADDR;
    }
    else
    {
        frame.mType = GetDevType( value );
    }
    frame.mData1 = value;
    frame.mFlags = 0;
    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = mMdio->GetSampleNumber();

    mResults->AddFrame( frame );
    ReportProgress( frame.mEndingSampleInclusive );
}